

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPoolDatabase::FindFileByName
          (DescriptorPoolDatabase *this,StringViewArg filename,FileDescriptorProto *output)

{
  FileDescriptor *this_00;
  string_view name;
  
  name._M_str = (filename->_M_dataplus)._M_p;
  name._M_len = filename->_M_string_length;
  this_00 = DescriptorPool::FindFileByName(this->pool_,name);
  if (this_00 != (FileDescriptor *)0x0) {
    FileDescriptorProto::Clear(output);
    FileDescriptor::CopyTo(this_00,output);
    if ((this->options_).preserve_source_code_info == true) {
      FileDescriptor::CopySourceCodeInfoTo(this_00,output);
    }
  }
  return this_00 != (FileDescriptor *)0x0;
}

Assistant:

bool DescriptorPoolDatabase::FindFileByName(
    StringViewArg filename, FileDescriptorProto* PROTOBUF_NONNULL output) {
  const FileDescriptor* file = pool_.FindFileByName(filename);
  if (file == nullptr) return false;
  output->Clear();
  file->CopyTo(output);
  if (options_.preserve_source_code_info) {
    file->CopySourceCodeInfoTo(output);
  }
  return true;
}